

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_uint64 ma_dr_flac__seek_forward_by_pcm_frames(ma_dr_flac *pFlac,ma_uint64 pcmFramesToSeek)

{
  uint uVar1;
  ma_bool32 mVar2;
  ulong uVar3;
  ma_uint64 mVar4;
  
  if (pcmFramesToSeek == 0) {
    mVar4 = 0;
  }
  else {
    mVar4 = 0;
    do {
      uVar1 = (pFlac->currentFLACFrame).pcmFramesRemaining;
      uVar3 = (ulong)uVar1;
      if (uVar3 == 0) {
        mVar2 = ma_dr_flac__read_and_decode_next_flac_frame(pFlac);
        if (mVar2 == 0) break;
      }
      else {
        if (pcmFramesToSeek < uVar3) {
          mVar4 = mVar4 + pcmFramesToSeek;
          (pFlac->currentFLACFrame).pcmFramesRemaining = uVar1 - (int)pcmFramesToSeek;
          break;
        }
        mVar4 = mVar4 + uVar3;
        (pFlac->currentFLACFrame).pcmFramesRemaining = 0;
        pcmFramesToSeek = pcmFramesToSeek - uVar3;
      }
    } while (pcmFramesToSeek != 0);
  }
  pFlac->currentPCMFrame = pFlac->currentPCMFrame + mVar4;
  return mVar4;
}

Assistant:

static ma_uint64 ma_dr_flac__seek_forward_by_pcm_frames(ma_dr_flac* pFlac, ma_uint64 pcmFramesToSeek)
{
    ma_uint64 pcmFramesRead = 0;
    while (pcmFramesToSeek > 0) {
        if (pFlac->currentFLACFrame.pcmFramesRemaining == 0) {
            if (!ma_dr_flac__read_and_decode_next_flac_frame(pFlac)) {
                break;
            }
        } else {
            if (pFlac->currentFLACFrame.pcmFramesRemaining > pcmFramesToSeek) {
                pcmFramesRead   += pcmFramesToSeek;
                pFlac->currentFLACFrame.pcmFramesRemaining -= (ma_uint32)pcmFramesToSeek;
                pcmFramesToSeek  = 0;
            } else {
                pcmFramesRead   += pFlac->currentFLACFrame.pcmFramesRemaining;
                pcmFramesToSeek -= pFlac->currentFLACFrame.pcmFramesRemaining;
                pFlac->currentFLACFrame.pcmFramesRemaining = 0;
            }
        }
    }
    pFlac->currentPCMFrame += pcmFramesRead;
    return pcmFramesRead;
}